

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O0

int mriStep_SetNonlinCRDown(ARKodeMem ark_mem,sunrealtype crdown)

{
  ARKodeMem in_XMM0_Qa;
  int retval;
  ARKodeMRIStepMem step_mem;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = mriStep_AccessStepMem
                      (in_XMM0_Qa,in_stack_ffffffffffffffe0,
                       (ARKodeMRIStepMem *)
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (local_4 == 0) {
    if (0.0 < (double)in_XMM0_Qa) {
      *(ARKodeMem *)(in_stack_ffffffffffffffe0 + 0xd8) = in_XMM0_Qa;
    }
    else {
      in_stack_ffffffffffffffe0[0xd8] = '3';
      in_stack_ffffffffffffffe0[0xd9] = '3';
      in_stack_ffffffffffffffe0[0xda] = '3';
      in_stack_ffffffffffffffe0[0xdb] = '3';
      in_stack_ffffffffffffffe0[0xdc] = '3';
      in_stack_ffffffffffffffe0[0xdd] = '3';
      in_stack_ffffffffffffffe0[0xde] = -0x2d;
      in_stack_ffffffffffffffe0[0xdf] = '?';
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mriStep_SetNonlinCRDown(ARKodeMem ark_mem, sunrealtype crdown)
{
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* if argument legal set it, otherwise set default */
  if (crdown <= ZERO) { step_mem->crdown = CRDOWN; }
  else { step_mem->crdown = crdown; }

  return (ARK_SUCCESS);
}